

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_math.cpp
# Opt level: O3

void __thiscall strain_example1_Test::TestBody(strain_example1_Test *this)

{
  unit_data uVar1;
  measurement *pmVar2;
  uint64_t in_RCX;
  string *__return_storage_ptr__;
  char *pcVar3;
  measurement strain;
  measurement length;
  measurement deltaLength;
  AssertHelper local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a0;
  undefined1 local_98 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  AssertHelper local_78;
  double local_70;
  float local_68;
  unit_data uStack_64;
  float local_5c;
  double local_58;
  double local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  
  local_30 = 0x3ee4f8b588e368f1;
  local_28 = 0x13f800000;
  local_40 = 0x3ff0000000000000;
  local_38 = 0x13f800000;
  uVar1 = units::detail::unit_data::operator/
                    ((unit_data *)((long)&local_28 + 4),(unit_data *)((long)&local_38 + 4));
  local_48 = (ulong)(uint)uVar1 << 0x20 | 0x3f800000;
  local_50 = 1e-05;
  pmVar2 = (measurement *)units::getDefaultFlags();
  __return_storage_ptr__ = (string *)local_98;
  units::to_string_abi_cxx11_(__return_storage_ptr__,(units *)&local_50,pmVar2,in_RCX);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[6]>
            ((internal *)&local_70,"to_string(strain)","\"1e-05\"",__return_storage_ptr__,
             (char (*) [6])"1e-05");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._0_8_ != &((string *)local_98)->field_2) {
    operator_delete((void *)local_98._0_8_,local_88._M_allocated_capacity + 1);
  }
  if (local_70._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_98);
    if ((undefined8 *)CONCAT44(uStack_64,local_68) == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)CONCAT44(uStack_64,local_68);
    }
    __return_storage_ptr__ = (string *)0x11e;
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_math.cpp",
               0x11e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_a8,(Message *)local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_98._0_8_ + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT44(uStack_64,local_68) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(uStack_64,local_68));
  }
  local_98._0_8_ = &DAT_4024000000000000;
  local_98._8_8_ = 0x13e9c0ebf;
  local_58 = local_50 * 10.0;
  local_5c = (float)local_48;
  uStack_64 = units::detail::unit_data::operator*
                        ((unit_data *)((long)&local_48 + 4),
                         (unit_data *)((long)&((string *)local_98)->_M_string_length + 4));
  local_68 = local_5c * 0.3048;
  local_70 = local_58;
  pmVar2 = (measurement *)units::getDefaultFlags();
  units::to_string_abi_cxx11_
            ((string *)local_98,(units *)&local_70,pmVar2,(uint64_t)__return_storage_ptr__);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[10]>
            ((internal *)&local_a8,"to_string(distortion)","\"0.0001 ft\"",(string *)local_98,
             (char (*) [10])"0.0001 ft");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._0_8_ != &((string *)local_98)->field_2) {
    operator_delete((void *)local_98._0_8_,local_88._M_allocated_capacity + 1);
  }
  if (local_a8.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_98);
    if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_math.cpp",
               0x122,pcVar3);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_98._0_8_ + 8))();
    }
  }
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0,local_a0);
  }
  return;
}

Assistant:

TEST(strain, example1)
{
    measurement deltaLength = 0.00001 * m;
    measurement length = 1 * m;

    auto strain = deltaLength / length;

    EXPECT_EQ(to_string(strain), "1e-05");

    // applied to a 10 ft bar
    auto distortion = strain * (10 * ft);
    EXPECT_EQ(to_string(distortion), "0.0001 ft");
}